

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::FillRuleTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FillRuleTestInstance *this)

{
  size_type *psVar1;
  deUint32 width;
  FillRuleCaseType FVar2;
  uint uVar3;
  TestLog *this_00;
  int i;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  pointer pVVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong *puVar11;
  long lVar12;
  Surface *surface;
  void *__buf;
  int iVar13;
  undefined8 uVar14;
  int iVar15;
  bool bVar16;
  ulong uVar17;
  int iVar18;
  int row;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Vec2 center;
  Vec2 sideH;
  Vec2 sideV;
  Vector<float,_2> res_4;
  Vector<float,_2> res_3;
  Random rnd;
  Surface resultImage;
  Vector<float,_2> res_1;
  string iterationDescription;
  ScopedLogSection section;
  Vector<float,_2> res_5;
  Vec2 quad [4];
  IVec4 colorBits;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> local_338;
  undefined1 local_318 [8];
  size_type local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  float local_2f4;
  string local_2f0;
  string local_2d0;
  float local_2b0 [5];
  int local_29c;
  int local_298;
  int local_294;
  ulong local_290;
  LogImageSet local_288;
  float local_244;
  Surface local_240;
  string local_228;
  string local_208;
  ScopedLogSection local_1e8;
  float local_1e0 [2];
  undefined1 local_1d8 [8];
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  _Alloc_hider local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [4];
  ios_base local_168 [8];
  ios_base local_160 [272];
  TestStatus *local_50;
  long local_48;
  tcu local_40 [4];
  char local_3c;
  char local_38;
  
  iVar13 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::ostream::operator<<((ostringstream *)local_1d8,iVar13 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_2f0,0,(char *)0x0,0xb4db6c);
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 == paVar10) {
    local_308._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_308._8_8_ = plVar5[3];
    local_318 = (undefined1  [8])&local_308;
  }
  else {
    local_308._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_318 = (undefined1  [8])*plVar5;
  }
  local_310 = plVar5[1];
  *plVar5 = (long)paVar10;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append(local_318);
  paVar10 = &local_288.m_name.field_2;
  puVar11 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar11) {
    local_288.m_name.field_2._M_allocated_capacity = *puVar11;
    local_288.m_name.field_2._8_8_ = plVar5[3];
    local_288.m_name._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_288.m_name.field_2._M_allocated_capacity = *puVar11;
    local_288.m_name._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_288.m_name._M_string_length = plVar5[1];
  *plVar5 = (long)puVar11;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::ostream::operator<<(local_1d8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != paVar10) {
    uVar14 = local_288.m_name.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < local_288.m_name._M_string_length + local_2d0._M_string_length) {
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      uVar14 = local_2d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < local_288.m_name._M_string_length + local_2d0._M_string_length)
    goto LAB_007bdaa9;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_288.m_name._M_dataplus._M_p);
  }
  else {
LAB_007bdaa9:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2d0._M_dataplus._M_p);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_208.field_2._M_allocated_capacity = *psVar1;
    local_208.field_2._8_8_ = puVar6[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar1;
    local_208._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_208._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != paVar10) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e8,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_208,&local_208);
  tcu::getTextureFormatBitDepth(local_40,&(this->super_BaseRenderingTestInstance).m_textureFormat);
  iVar13 = 1 << (8U - (char)local_40[0] & 0x1f);
  local_294 = 1 << (8U - local_3c & 0x1f);
  local_298 = 1 << (8U - local_38 & 0x1f);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_240,width,width);
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FVar2 = this->m_caseType;
  local_29c = iVar13;
  if (FVar2 < FILLRULECASE_LAST) {
    local_290 = (ulong)(uint)this->m_iteration;
    if ((0x13U >> (FVar2 & 0x1f) & 1) == 0) {
      local_288.m_name._M_dataplus._M_p._4_4_ = 0x3f000000;
      if (FVar2 != FILLRULECASE_CLIPPED_PARTIAL) {
        local_288.m_name._M_dataplus._M_p._4_4_ = 0;
      }
      fVar20 = *(float *)(&DAT_00b4d108 + (ulong)(FVar2 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      local_288.m_name._M_dataplus._M_p._0_4_ = local_288.m_name._M_dataplus._M_p._4_4_;
      local_2f4 = ((float)this->m_iteration / (float)(this->m_iterationCount + -1)) * 3.1415927 *
                  0.5;
      fVar21 = cosf(local_2f4);
      local_1d8._4_4_ = sinf(local_2f4);
      local_1d8._0_4_ = fVar21;
      local_318 = (undefined1  [8])0x0;
      lVar12 = 0;
      do {
        *(float *)(local_318 + lVar12 * 4) = *(float *)(local_1d8 + lVar12 * 4) * fVar20;
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_2f0._M_dataplus._M_p =
           (pointer)(CONCAT44(local_318._0_4_,local_318._4_4_) ^ 0x8000000000000000);
      local_2d0._M_dataplus._M_p = (pointer)0x0;
      lVar12 = 0;
      do {
        *(float *)((long)&local_2d0._M_dataplus._M_p + lVar12 * 4) =
             *(float *)((long)&local_288.m_name._M_dataplus._M_p + lVar12 * 4) +
             *(float *)(local_318 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_1d8 = (undefined1  [8])0x0;
      lVar12 = 0;
      do {
        *(float *)(local_1d8 + lVar12 * 4) =
             *(float *)((long)&local_2d0._M_dataplus._M_p + lVar12 * 4) +
             *(float *)((long)&local_2f0._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_228._M_dataplus._M_p = (pointer)0x0;
      lVar12 = 0;
      do {
        *(float *)((long)&local_228._M_dataplus._M_p + lVar12 * 4) =
             *(float *)((long)&local_288.m_name._M_dataplus._M_p + lVar12 * 4) +
             *(float *)(local_318 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      uStack_1d0 = 0;
      lVar12 = 0;
      do {
        *(float *)((long)&uStack_1d0 + lVar12 * 4) =
             *(float *)((long)&local_228._M_dataplus._M_p + lVar12 * 4) -
             *(float *)((long)&local_2f0._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_2b0[2] = 0.0;
      local_2b0[3] = 0.0;
      lVar12 = 0;
      do {
        local_2b0[lVar12 + 2] =
             *(float *)((long)&local_288.m_name._M_dataplus._M_p + lVar12 * 4) -
             *(float *)(local_318 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_1c8._0_8_ = 0;
      lVar12 = 0;
      do {
        *(float *)(local_1c8 + lVar12 * 4) =
             local_2b0[lVar12 + 2] - *(float *)((long)&local_2f0._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_2b0[0] = 0.0;
      local_2b0[1] = 0.0;
      lVar12 = 0;
      do {
        local_2b0[lVar12] =
             *(float *)((long)&local_288.m_name._M_dataplus._M_p + lVar12 * 4) -
             *(float *)(local_318 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_1c8._8_8_ = 0;
      lVar12 = 0;
      do {
        *(float *)(local_1c8 + lVar12 * 4 + 8) =
             local_2b0[lVar12] + *(float *)((long)&local_2f0._M_dataplus._M_p + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_338,6);
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[0] = (float)local_1d8._0_4_;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[1] = (float)local_1d8._4_4_;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      *(size_type *)
       local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start[1].m_data = uStack_1d0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = (float)local_1c8._0_4_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = (float)local_1c8._4_4_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = (float)local_1c8._0_4_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = (float)local_1c8._4_4_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = (float)local_1d8._0_4_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = (float)local_1d8._4_4_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      *(undefined8 *)
       local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start[5].m_data = local_1c8._8_8_;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init((deRandom *)&local_288,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&local_338,0x60);
      local_290 = (ulong)(uint)((int)local_290 << 4);
      lVar12 = 0;
      local_50 = __return_storage_ptr__;
      do {
        fVar20 = ((float)(int)lVar12 + 0.5) * 0.25;
        local_2f4 = fVar20 + fVar20 + -1.0;
        uVar17 = lVar12 * 4;
        iVar13 = (int)local_290;
        uVar19 = 0;
        local_48 = lVar12;
        do {
          fVar20 = ((float)(int)uVar19 + 0.5) * 0.25;
          local_318._4_4_ = local_2f4;
          local_318._0_4_ = fVar20 + fVar20 + -1.0;
          fVar20 = ((float)(iVar13 + (int)lVar12 * 4 + (int)uVar19) /
                   (float)(this->m_iterationCount << 4)) * 3.1415927 * 0.5;
          fVar21 = cosf(fVar20);
          local_1d8._4_4_ = sinf(fVar20);
          local_1d8._0_4_ = fVar21;
          local_2f0._M_dataplus._M_p = (pointer)0x0;
          lVar7 = 0;
          do {
            *(float *)((long)&local_2f0._M_dataplus._M_p + lVar7 * 4) =
                 *(float *)(local_1d8 + lVar7 * 4) * 0.15;
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_2d0._M_dataplus._M_p =
               (pointer)(CONCAT44(local_2f0._M_dataplus._M_p._0_4_,local_2f0._M_dataplus._M_p._4_4_)
                        ^ 0x8000000000000000);
          local_228._M_dataplus._M_p = (pointer)0x0;
          lVar7 = 0;
          do {
            *(float *)((long)&local_228._M_dataplus._M_p + lVar7 * 4) =
                 *(float *)(local_318 + lVar7 * 4) +
                 *(float *)((long)&local_2f0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1d8 = (undefined1  [8])0x0;
          lVar7 = 0;
          do {
            *(float *)(local_1d8 + lVar7 * 4) =
                 *(float *)((long)&local_228._M_dataplus._M_p + lVar7 * 4) +
                 *(float *)((long)&local_2d0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_2b0[2] = 0.0;
          local_2b0[3] = 0.0;
          lVar7 = 0;
          do {
            local_2b0[lVar7 + 2] =
                 *(float *)(local_318 + lVar7 * 4) +
                 *(float *)((long)&local_2f0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          uStack_1d0 = 0;
          lVar7 = 0;
          do {
            *(float *)((long)&uStack_1d0 + lVar7 * 4) =
                 local_2b0[lVar7 + 2] - *(float *)((long)&local_2d0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_2b0[0] = 0.0;
          local_2b0[1] = 0.0;
          lVar7 = 0;
          do {
            local_2b0[lVar7] =
                 *(float *)(local_318 + lVar7 * 4) -
                 *(float *)((long)&local_2f0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1c8._0_8_ = 0;
          lVar7 = 0;
          do {
            *(float *)(local_1c8 + lVar7 * 4) =
                 local_2b0[lVar7] - *(float *)((long)&local_2d0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1e0[0] = 0.0;
          local_1e0[1] = 0.0;
          lVar7 = 0;
          do {
            local_1e0[lVar7] =
                 *(float *)(local_318 + lVar7 * 4) -
                 *(float *)((long)&local_2f0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          local_1c8._8_8_ = 0;
          lVar7 = 0;
          do {
            *(float *)(local_1c8 + lVar7 * 4 + 8) =
                 local_1e0[lVar7] + *(float *)((long)&local_2d0._M_dataplus._M_p + lVar7 * 4);
            lVar7 = lVar7 + 1;
          } while (lVar7 == 1);
          FVar2 = this->m_caseType;
          if (FVar2 == FILLRULECASE_PROJECTED) {
            fVar20 = deRandom_getFloat((deRandom *)&local_288);
            fVar20 = fVar20 * 3.9 + 0.1;
            fVar21 = deRandom_getFloat((deRandom *)&local_288);
            local_244 = fVar21 * 3.9 + 0.1;
            fVar21 = deRandom_getFloat((deRandom *)&local_288);
            fVar22 = deRandom_getFloat((deRandom *)&local_288);
            fVar21 = fVar21 * 3.9 + 0.1;
            fVar22 = fVar22 * 3.9 + 0.1;
            uVar8 = uVar19 | uVar17;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[0] =
                 (float)local_1d8._0_4_ * fVar20;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[1] =
                 (float)local_1d8._4_4_ * fVar20;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[2] = 0.0;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[3] = fVar20;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[0] =
                 (float)uStack_1d0 * local_244;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[1] =
                 uStack_1d0._4_4_ * local_244;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[2] = 0.0;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[3] = local_244;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[0] =
                 (float)local_1c8._0_4_ * fVar21;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[1] =
                 (float)local_1c8._4_4_ * fVar21;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[2] = 0.0;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[3] = fVar21;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[0] =
                 (float)local_1c8._0_4_ * fVar21;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[1] =
                 (float)local_1c8._4_4_ * fVar21;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[2] = 0.0;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[3] = fVar21;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[0] =
                 (float)local_1d8._0_4_ * fVar20;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[1] =
                 (float)local_1d8._4_4_ * fVar20;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[2] = 0.0;
            local_338.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[3] = fVar20;
            fVar20 = (float)local_1c8._8_4_ * fVar22;
            fVar21 = (float)local_1c8._12_4_ * fVar22;
            pVVar9 = local_338.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8 * 6;
LAB_007be259:
            pVVar9[5].m_data[0] = fVar20;
            pVVar9[5].m_data[1] = fVar21;
            pVVar9[5].m_data[2] = 0.0;
            pVVar9[5].m_data[3] = fVar22;
          }
          else {
            if (FVar2 == FILLRULECASE_REVERSED) {
              uVar8 = uVar19 | uVar17;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[0] = (float)local_1d8._0_4_
              ;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[1] = (float)local_1d8._4_4_
              ;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[3] = 1.0;
              *(size_type *)
               local_338.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data = uStack_1d0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[3] = 1.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[0] =
                   (float)local_1c8._0_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[1] =
                   (float)local_1c8._4_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[3] = 1.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[0] =
                   (float)local_1d8._0_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[1] =
                   (float)local_1d8._4_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[3] = 1.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[0] =
                   (float)local_1c8._0_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[1] =
                   (float)local_1c8._4_4_;
LAB_007be0a3:
              (local_338.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + 4)[(uVar19 | uVar17) * 6].m_data[2] = 0.0;
              (local_338.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + 4)[(uVar19 | uVar17) * 6].m_data[3] = 1.0;
              pVVar9 = local_338.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (uVar19 | uVar17) * 6;
              fVar22 = 1.0;
              fVar20 = (float)local_1c8._8_4_;
              fVar21 = (float)local_1c8._12_4_;
              goto LAB_007be259;
            }
            if (FVar2 == FILLRULECASE_BASIC) {
              uVar8 = uVar19 | uVar17;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[0] = (float)local_1d8._0_4_
              ;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[1] = (float)local_1d8._4_4_
              ;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6].m_data[3] = 1.0;
              *(size_type *)
               local_338.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data = uStack_1d0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 1].m_data[3] = 1.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[0] =
                   (float)local_1c8._0_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[1] =
                   (float)local_1c8._4_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 2].m_data[3] = 1.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[0] =
                   (float)local_1c8._0_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[1] =
                   (float)local_1c8._4_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[2] = 0.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 3].m_data[3] = 1.0;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[0] =
                   (float)local_1d8._0_4_;
              local_338.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8 * 6 + 4].m_data[1] =
                   (float)local_1d8._4_4_;
              goto LAB_007be0a3;
            }
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != 4);
        lVar12 = local_48 + 1;
        __return_storage_ptr__ = local_50;
      } while (lVar12 != 4);
    }
  }
  local_1d8 = (undefined1  [8])0x3f0000003f000000;
  uStack_1d0 = 0x3f8000003f000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_288,
             (long)local_338.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_338.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)local_1d8,
             (allocator_type *)local_318);
  local_1d8 = (undefined1  [8])
              ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1d0,
             "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
             ,0x65);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
  std::ios_base::~ios_base(local_160);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,&local_240,&local_338,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&local_288,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity -
                    (long)local_288.m_name._M_dataplus._M_p);
  }
  local_1d8 = (undefined1  [8])
              ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
              m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&uStack_1d0,"Verifying result.",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
  std::ios_base::~ios_base(local_160);
  iVar4 = 0;
  iVar13 = iVar4;
  if (0 < local_240.m_height) {
    iVar15 = 0;
    iVar13 = 0;
    do {
      uVar17 = (ulong)(uint)local_240.m_width;
      iVar18 = iVar4;
      if (0 < local_240.m_width) {
        do {
          uVar3 = *(uint *)((long)local_240.m_pixels.m_ptr + (long)iVar18 * 4);
          if (((local_29c < (int)((uVar3 & 0xff) - 0x7f)) ||
              (local_294 < (int)((uVar3 >> 8 & 0xff) - 0x7f))) ||
             (local_298 < (int)((uVar3 >> 0x10 & 0xff) - 0x7f))) {
            iVar13 = 1;
          }
          iVar18 = iVar18 + 1;
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
      }
      iVar15 = iVar15 + 1;
      iVar4 = iVar4 + local_240.m_width;
    } while (iVar15 != local_240.m_height);
  }
  if (iVar13 == 0) {
    local_1d8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1d0,"No overlapping fragments detected.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
    std::ios_base::~ios_base(local_160);
  }
  else {
    local_1d8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1d0,"Overlapping fragments detected, image is not valid.",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
    std::ios_base::~ios_base(local_160);
    this->m_allIterationsPassed = false;
  }
  if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
    local_1d8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1d0,"Searching missing fragments.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
    std::ios_base::~ios_base(local_160);
    if (0 < local_240.m_height) {
      iVar13 = 0;
      iVar4 = 0;
      bVar16 = false;
      do {
        uVar17 = (ulong)(uint)local_240.m_width;
        iVar15 = iVar13;
        if (0 < local_240.m_width) {
          do {
            uVar3 = *(uint *)((long)local_240.m_pixels.m_ptr + (long)iVar15 * 4);
            if ((((int)(uVar3 & 0xff) <= local_29c) || ((int)(uVar3 >> 8 & 0xff) <= local_294)) ||
               ((int)(uVar3 >> 0x10 & 0xff) <= local_298)) {
              bVar16 = true;
            }
            iVar15 = iVar15 + 1;
            uVar17 = uVar17 - 1;
          } while (uVar17 != 0);
        }
        iVar4 = iVar4 + 1;
        iVar13 = iVar13 + local_240.m_width;
      } while (iVar4 != local_240.m_height);
      if (bVar16) {
        local_1d8 = (undefined1  [8])
                    ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                    m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_1d0,"Missing fragments detected, image is not valid.",0x2f);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
        std::ios_base::~ios_base(local_160);
        this->m_allIterationsPassed = false;
        goto LAB_007bea01;
      }
    }
    local_1d8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1d0,"No missing fragments detected.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1d0);
    std::ios_base::~ios_base(local_160);
  }
LAB_007bea01:
  this_00 = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log
  ;
  local_318 = (undefined1  [8])&local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"Result of rendering","");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"Result of rendering","");
  tcu::LogImageSet::LogImageSet(&local_288,(string *)local_318,&local_2f0);
  tcu::TestLog::startImageSet
            (this_00,local_288.m_name._M_dataplus._M_p,local_288.m_description._M_dataplus._M_p);
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"Result","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"Result","");
  surface = &local_240;
  tcu::LogImage::LogImage
            ((LogImage *)local_1d8,&local_2d0,&local_228,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1d8,(int)this_00,__buf,(size_t)surface);
  tcu::TestLog::endImageSet(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_p != local_1a8) {
    operator_delete(local_1b8._M_p,local_1a8[0]._M_allocated_capacity + 1);
  }
  if (local_1d8 != (undefined1  [8])local_1c8) {
    operator_delete((void *)local_1d8,local_1c8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_description._M_dataplus._M_p != &local_288.m_description.field_2) {
    operator_delete(local_288.m_description._M_dataplus._M_p,
                    local_288.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.m_name._M_dataplus._M_p != &local_288.m_name.field_2) {
    operator_delete(local_288.m_name._M_dataplus._M_p,
                    local_288.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if (local_318 != (undefined1  [8])&local_308) {
    operator_delete((void *)local_318,local_308._M_allocated_capacity + 1);
  }
  iVar13 = this->m_iteration + 1;
  this->m_iteration = iVar13;
  if (iVar13 == this->m_iterationCount) {
    local_1d8 = (undefined1  [8])local_1c8;
    if (this->m_allIterationsPassed == true) {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1d8,
                 (pointer)((long)local_1d8 + uStack_1d0));
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Found invalid pixels","")
      ;
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1d8,
                 (pointer)((long)local_1d8 + uStack_1d0));
    }
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8,local_1c8._0_8_ + 1);
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if (local_338.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_240);
  tcu::TestLog::endSection(local_1e8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus FillRuleTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	tcu::IVec4								colorBits				= tcu::getTextureFormatBitDepth(getTextureFormat());
	const int								thresholdRed			= 1 << (8 - colorBits[0]);
	const int								thresholdGreen			= 1 << (8 - colorBits[1]);
	const int								thresholdBlue			= 1 << (8 - colorBits[2]);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, colorBuffer, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			m_allIterationsPassed = false;
		}
	}

	m_context.getTestContext().getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
										<< tcu::TestLog::Image("Result", "Result", resultImage)
										<< tcu::TestLog::EndImageSet;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixels");
	}
	else
		return tcu::TestStatus::incomplete();
}